

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadDsd.c
# Opt level: O0

Abc_Obj_t * Io_ReadDsd_rec(Abc_Ntk_t *pNtk,char *pCur,char *pSop)

{
  bool bVar1;
  Abc_Obj_t *pAVar2;
  size_t sVar3;
  char *pcVar4;
  int local_154;
  int local_150;
  int TypeExor;
  int nParts;
  int i;
  char *pParts [32];
  char *local_40;
  char *pEnd;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  char *pSop_local;
  char *pCur_local;
  Abc_Ntk_t *pNtk_local;
  
  if (*pCur == '!') {
    pAVar2 = Io_ReadDsd_rec(pNtk,pCur + 1,(char *)0x0);
    pNtk_local = (Abc_Ntk_t *)Abc_NtkCreateNodeInv(pNtk,pAVar2);
  }
  else if (*pCur == '(') {
    sVar3 = strlen(pCur);
    if (pCur[sVar3 - 1] != ')') {
      __assert_fail("pCur[strlen(pCur)-1] == \')\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadDsd.c"
                    ,0x9e,"Abc_Obj_t *Io_ReadDsd_rec(Abc_Ntk_t *, char *, char *)");
    }
    sVar3 = strlen(pCur);
    pCur[sVar3 - 1] = '\0';
    local_150 = Io_ReadDsdStrSplit(pCur + 1,(char **)&nParts,&local_154);
    if (local_150 == 0) {
      Abc_NtkDelete(pNtk);
      pNtk_local = (Abc_Ntk_t *)0x0;
    }
    else {
      pNtk_local = (Abc_Ntk_t *)Abc_NtkCreateNode(pNtk);
      if (pSop == (char *)0x0) {
        for (TypeExor = 0; TypeExor < local_150; TypeExor = TypeExor + 1) {
          pAVar2 = Io_ReadDsd_rec(pNtk,*(char **)(&nParts + (long)TypeExor * 2),(char *)0x0);
          if (pAVar2 == (Abc_Obj_t *)0x0) {
            return (Abc_Obj_t *)0x0;
          }
          Abc_ObjAddFanin((Abc_Obj_t *)pNtk_local,pAVar2);
        }
      }
      else {
        for (TypeExor = 0; TypeExor < local_150; TypeExor = TypeExor + 1) {
          pAVar2 = Io_ReadDsd_rec(pNtk,*(char **)(&nParts + (long)TypeExor * 2),(char *)0x0);
          if (pAVar2 == (Abc_Obj_t *)0x0) {
            return (Abc_Obj_t *)0x0;
          }
          Abc_ObjAddFanin((Abc_Obj_t *)pNtk_local,pAVar2);
        }
      }
      if (pSop == (char *)0x0) {
        if (local_154 == 0) {
          pcVar4 = Abc_SopCreateAnd((Mem_Flex_t *)pNtk->pManFunc,local_150,(int *)0x0);
          ((anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 *)&pNtk_local->vCis)->pData = pcVar4;
        }
        else {
          pcVar4 = Abc_SopCreateXorSpecial((Mem_Flex_t *)pNtk->pManFunc,local_150);
          ((anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 *)&pNtk_local->vCis)->pData = pcVar4;
        }
      }
      else {
        pcVar4 = Abc_SopRegister((Mem_Flex_t *)pNtk->pManFunc,pSop);
        ((anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 *)&pNtk_local->vCis)->pData = pcVar4;
      }
    }
  }
  else {
    local_40 = pCur;
    if ((*pCur < 'a') || ('z' < *pCur)) {
      while( true ) {
        if (((*local_40 < '0') || (bVar1 = true, '9' < *local_40)) &&
           (bVar1 = false, '@' < *local_40)) {
          bVar1 = *local_40 < 'G';
        }
        if (!bVar1) break;
        local_40 = local_40 + 1;
      }
      if (*local_40 == '(') {
        *local_40 = '\0';
        pcVar4 = Abc_SopFromTruthHex(pCur);
        *local_40 = '(';
        pNtk_local = (Abc_Ntk_t *)Io_ReadDsd_rec(pNtk,local_40,pcVar4);
        if (pcVar4 != (char *)0x0) {
          free(pcVar4);
        }
      }
      else {
        printf("Cannot find the end of hexidecimal truth table.\n");
        pNtk_local = (Abc_Ntk_t *)0x0;
      }
    }
    else {
      if (pCur[1] != '\0') {
        __assert_fail("*(pCur+1) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadDsd.c"
                      ,0xc6,"Abc_Obj_t *Io_ReadDsd_rec(Abc_Ntk_t *, char *, char *)");
      }
      pNtk_local = (Abc_Ntk_t *)Abc_NtkPi(pNtk,*pCur + -0x61);
    }
  }
  return (Abc_Obj_t *)pNtk_local;
}

Assistant:

Abc_Obj_t * Io_ReadDsd_rec( Abc_Ntk_t * pNtk, char * pCur, char * pSop )
{
    Abc_Obj_t * pObj, * pFanin;
    char * pEnd, * pParts[32];
    int i, nParts, TypeExor;

    // consider complemented formula
    if ( *pCur == '!' )
    {
        pObj = Io_ReadDsd_rec( pNtk, pCur + 1, NULL );
        return Abc_NtkCreateNodeInv( pNtk, pObj );
    }
    if ( *pCur == '(' )
    {
        assert( pCur[strlen(pCur)-1] == ')' );
        pCur[strlen(pCur)-1] = 0;
        nParts = Io_ReadDsdStrSplit( pCur+1, pParts, &TypeExor );
        if ( nParts == 0 )
        {
            Abc_NtkDelete( pNtk );
            return NULL;
        }
        pObj = Abc_NtkCreateNode( pNtk );
        if ( pSop )
        {
//            for ( i = nParts - 1; i >= 0; i-- )
            for ( i = 0; i < nParts; i++ )
            {
                pFanin = Io_ReadDsd_rec( pNtk, pParts[i], NULL );
                if ( pFanin == NULL )
                    return NULL;
                Abc_ObjAddFanin( pObj, pFanin );
            }
        }
        else
        {
            for ( i = 0; i < nParts; i++ )
            {
                pFanin = Io_ReadDsd_rec( pNtk, pParts[i], NULL );
                if ( pFanin == NULL )
                    return NULL;
                Abc_ObjAddFanin( pObj, pFanin );
            }
        }
        if ( pSop )
            pObj->pData = Abc_SopRegister( (Mem_Flex_t *)pNtk->pManFunc, pSop );
        else if ( TypeExor )
            pObj->pData = Abc_SopCreateXorSpecial( (Mem_Flex_t *)pNtk->pManFunc, nParts );
        else
            pObj->pData = Abc_SopCreateAnd( (Mem_Flex_t *)pNtk->pManFunc, nParts, NULL );
        return pObj;
    }
    if ( *pCur >= 'a' && *pCur <= 'z' )
    {
        assert( *(pCur+1) == 0 );
        return Abc_NtkPi( pNtk, *pCur - 'a' );
    }

    // skip hex truth table
    pEnd = pCur;
    while ( (*pEnd >= '0' && *pEnd <= '9') || (*pEnd >= 'A' && *pEnd <= 'F') )
        pEnd++;
    if ( *pEnd != '(' )
    {
        printf( "Cannot find the end of hexidecimal truth table.\n" );
        return NULL;
    }

    // parse the truth table
    *pEnd = 0;
    pSop = Abc_SopFromTruthHex( pCur );
    *pEnd = '(';
    pObj = Io_ReadDsd_rec( pNtk, pEnd, pSop );
    ABC_FREE( pSop );
    return pObj;
}